

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

llama_rope_type llama_model_rope_type(llama_model *model)

{
  llama_rope_type lVar1;
  
  lVar1 = LLAMA_ROPE_TYPE_NONE;
  switch(model->arch) {
  case LLM_ARCH_LLAMA:
  case LLM_ARCH_LLAMA4:
  case LLM_ARCH_DECI:
  case LLM_ARCH_BAICHUAN:
  case LLM_ARCH_STARCODER:
  case LLM_ARCH_PLAMO:
  case LLM_ARCH_ORION:
  case LLM_ARCH_INTERNLM2:
  case LLM_ARCH_MINICPM:
  case LLM_ARCH_XVERSE:
  case LLM_ARCH_COMMAND_R:
  case LLM_ARCH_COHERE2:
  case LLM_ARCH_OLMO:
  case LLM_ARCH_ARCTIC:
  case LLM_ARCH_DEEPSEEK:
  case LLM_ARCH_DEEPSEEK2:
  case LLM_ARCH_CHATGLM:
  case LLM_ARCH_GLM4:
  case LLM_ARCH_GRANITE:
  case LLM_ARCH_GRANITE_MOE:
  case LLM_ARCH_CHAMELEON:
  case LLM_ARCH_PLM:
  case LLM_ARCH_BAILINGMOE:
    lVar1 = LLAMA_ROPE_TYPE_NORM;
    break;
  case LLM_ARCH_FALCON:
  case LLM_ARCH_GROK:
  case LLM_ARCH_GPTNEOX:
  case LLM_ARCH_BERT:
  case LLM_ARCH_NOMIC_BERT:
  case LLM_ARCH_STABLELM:
  case LLM_ARCH_QWEN:
  case LLM_ARCH_QWEN2:
  case LLM_ARCH_QWEN2MOE:
  case LLM_ARCH_QWEN3:
  case LLM_ARCH_QWEN3MOE:
  case LLM_ARCH_PHI2:
  case LLM_ARCH_PHI3:
  case LLM_ARCH_PHIMOE:
  case LLM_ARCH_CODESHELL:
  case LLM_ARCH_MINICPM3:
  case LLM_ARCH_GEMMA:
  case LLM_ARCH_GEMMA2:
  case LLM_ARCH_GEMMA3:
  case LLM_ARCH_STARCODER2:
  case LLM_ARCH_DBRX:
  case LLM_ARCH_OLMO2:
  case LLM_ARCH_OLMOE:
  case LLM_ARCH_OPENELM:
  case LLM_ARCH_BITNET:
  case LLM_ARCH_NEMOTRON:
  case LLM_ARCH_EXAONE:
    return LLAMA_ROPE_TYPE_NEOX;
  case LLM_ARCH_QWEN2VL:
    return LLAMA_ROPE_TYPE_MROPE;
  case LLM_ARCH_UNKNOWN:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x33b0,"unknown architecture");
  }
  return lVar1;
}

Assistant:

llama_rope_type llama_model_rope_type(const llama_model * model) {
    switch (model->arch) {
        // these models do not use RoPE
        case LLM_ARCH_GPT2:
        case LLM_ARCH_GPTJ:
        case LLM_ARCH_MPT:
        case LLM_ARCH_REFACT:
        case LLM_ARCH_BLOOM:
        case LLM_ARCH_MAMBA:
        case LLM_ARCH_JINA_BERT_V2:
        case LLM_ARCH_T5:
        case LLM_ARCH_T5ENCODER:
        case LLM_ARCH_JAIS:
        case LLM_ARCH_RWKV6:
        case LLM_ARCH_RWKV6QWEN2:
        case LLM_ARCH_RWKV7:
        case LLM_ARCH_ARWKV7:
        case LLM_ARCH_WAVTOKENIZER_DEC:
            return LLAMA_ROPE_TYPE_NONE;

        // use what we call a normal RoPE, operating on pairs of consecutive head values
        case LLM_ARCH_LLAMA:
        case LLM_ARCH_LLAMA4:
        case LLM_ARCH_DECI:
        case LLM_ARCH_BAICHUAN:
        case LLM_ARCH_STARCODER:
        case LLM_ARCH_PLAMO:
        case LLM_ARCH_ORION:
        case LLM_ARCH_INTERNLM2:
        case LLM_ARCH_MINICPM:
        case LLM_ARCH_XVERSE:
        case LLM_ARCH_COMMAND_R:
        case LLM_ARCH_COHERE2:
        case LLM_ARCH_OLMO:
        case LLM_ARCH_ARCTIC:
        case LLM_ARCH_DEEPSEEK:
        case LLM_ARCH_DEEPSEEK2:
        case LLM_ARCH_PLM:
        case LLM_ARCH_CHATGLM:
        case LLM_ARCH_GLM4:
        case LLM_ARCH_GRANITE:
        case LLM_ARCH_GRANITE_MOE:
        case LLM_ARCH_CHAMELEON:
        case LLM_ARCH_BAILINGMOE:
            return LLAMA_ROPE_TYPE_NORM;

        // the pairs of head values are offset by n_rot/2
        case LLM_ARCH_FALCON:
        case LLM_ARCH_GROK:
        case LLM_ARCH_DBRX:
        case LLM_ARCH_BERT:
        case LLM_ARCH_NOMIC_BERT:
        case LLM_ARCH_STABLELM:
        case LLM_ARCH_BITNET:
        case LLM_ARCH_QWEN:
        case LLM_ARCH_QWEN2:
        case LLM_ARCH_QWEN2MOE:
        case LLM_ARCH_QWEN3:
        case LLM_ARCH_QWEN3MOE:
        case LLM_ARCH_OLMO2:
        case LLM_ARCH_OLMOE:
        case LLM_ARCH_PHI2:
        case LLM_ARCH_PHI3:
        case LLM_ARCH_PHIMOE:
        case LLM_ARCH_GEMMA:
        case LLM_ARCH_GEMMA2:
        case LLM_ARCH_GEMMA3:
        case LLM_ARCH_STARCODER2:
        case LLM_ARCH_OPENELM:
        case LLM_ARCH_GPTNEOX:
        case LLM_ARCH_CODESHELL:
        case LLM_ARCH_NEMOTRON:
        case LLM_ARCH_EXAONE:
        case LLM_ARCH_MINICPM3:
            return LLAMA_ROPE_TYPE_NEOX;

        case LLM_ARCH_QWEN2VL:
            return LLAMA_ROPE_TYPE_MROPE;

        // all model arches should be listed explicitly here
        case LLM_ARCH_UNKNOWN:
            GGML_ABORT("unknown architecture");
    }

    return LLAMA_ROPE_TYPE_NONE;
}